

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O3

PClass * __thiscall DActiveButton::StaticType(DActiveButton *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

DActiveButton::DActiveButton ()
{
	m_Side = NULL;
	m_Part = -1;
	m_SwitchDef = 0;
	m_Timer = 0;
	m_Pos = { 0,0 };
	bFlippable = false;
	bReturning = false;
	m_Frame = 0;
}